

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_callback.cc
# Opt level: O1

vector<double,_std::allocator<double>_> *
bidirectional::additiveForwardREF
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *cumulative_resource,
          vector<double,_std::allocator<double>_> *edge_resource_consumption)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,cumulative_resource);
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    pdVar3 = (edge_resource_consumption->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    do {
      *pdVar2 = *pdVar2 + *pdVar3;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
    } while (pdVar2 != pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> additiveForwardREF(
    const std::vector<double>& cumulative_resource,
    const std::vector<double>& edge_resource_consumption) {
  // Add element wise
  std::vector<double> new_resources = cumulative_resource;
  std::transform(
      new_resources.begin(),
      new_resources.end(),
      edge_resource_consumption.begin(),
      new_resources.begin(),
      std::plus<double>());
  return new_resources;
}